

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O2

void hputc(char *hstring,char *keyword,char *value)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  char *pcVar13;
  undefined8 local_e0;
  char newcom [50];
  char line [100];
  
  sVar4 = strlen(keyword);
  sVar5 = strlen(value);
  iVar1 = (int)sVar5;
  if ((int)sVar4 == 7) {
    lVar10 = 7;
    iVar2 = strncmp(keyword,"COMMENT",7);
    if ((iVar2 == 0) || (iVar2 = strncmp(keyword,"HISTORY",7), iVar2 == 0)) {
      pcVar6 = ksearch(hstring,"END");
      strncpy(pcVar6 + 0x50,pcVar6,0x50);
      strncpy(pcVar6,keyword,7);
      for (; lVar10 != 0x50; lVar10 = lVar10 + 1) {
        pcVar6[lVar10] = ' ';
      }
      strncpy(pcVar6 + 9,value,(long)iVar1);
      return;
    }
  }
  pcVar6 = ksearch(hstring,keyword);
  local_e0 = keyword;
  if (pcVar6 != (char *)0x0) {
    pcVar8 = line;
    strncpy(pcVar8,pcVar6,0x50);
    line[0x50] = '\0';
    pcVar7 = strchr(pcVar8,0x27);
    if (pcVar7 != (char *)0x0) {
      pcVar8 = strchr(pcVar7 + 1,0x27);
    }
    pcVar7 = pcVar6 + 0x50;
    pcVar9 = strchr(pcVar8,0x2f);
    pcVar8 = pcVar6;
    if (pcVar9 == (char *)0x0) {
      newcom[0] = '\0';
      iVar2 = 0;
    }
    else {
      sVar5 = (size_t)(((int)line - (int)pcVar9) + 0x50);
      strncpy(newcom,pcVar9 + 1,sVar5);
      pcVar9 = newcom + (sVar5 - 1);
      while ((newcom < pcVar9 && (pcVar9 = pcVar9 + -1, *pcVar9 == ' '))) {
        *pcVar9 = '\0';
      }
      sVar5 = strlen(newcom);
      iVar2 = (int)sVar5;
    }
    goto LAB_0019048f;
  }
  lVar10 = 0;
  for (pcVar6 = hstring; (lVar10 != -0xe100 && (*pcVar6 != '\0')); pcVar6 = pcVar6 + 1) {
    lVar10 = lVar10 + -1;
  }
  pcVar8 = hstring;
  do {
    while( true ) {
      if ((pcVar6 <= pcVar8) ||
         (pcVar7 = strnsrch(pcVar8,"END",((int)hstring - (int)lVar10) - (int)pcVar8),
         pcVar7 == (char *)0x0)) goto LAB_0019044d;
      lVar12 = ((long)pcVar7 - (long)hstring) % 0x50;
      if ((lVar12 < 8) && (0x5d < (byte)(pcVar7[3] - 0x21U) || pcVar7[3] == '=')) break;
      pcVar8 = pcVar7 + 1;
    }
    pcVar13 = pcVar7 + -lVar12;
    for (pcVar9 = pcVar13; pcVar9 < pcVar7; pcVar9 = pcVar9 + 1) {
      if (*pcVar9 != ' ') {
        pcVar8 = pcVar7 + 1;
      }
    }
  } while (pcVar7 < pcVar8);
  if (pcVar13 == hstring) {
LAB_0019044d:
    pcVar6 = ksearch(hstring,"END");
    pcVar7 = pcVar6 + 0x50;
    strncpy(pcVar7,pcVar6,0x50);
  }
  else {
    pcVar7 = pcVar7 + (0xa0 - lVar12);
    do {
      pcVar6 = pcVar7;
      iVar2 = strncmp(pcVar6 + -0xf0,"        ",8);
      pcVar7 = pcVar6 + -0x50;
    } while (iVar2 == 0);
    pcVar6 = pcVar6 + -0xa0;
    if (pcVar13 <= pcVar6) goto LAB_0019044d;
  }
  newcom[0] = '\0';
  iVar2 = 0;
  pcVar8 = pcVar6;
LAB_0019048f:
  for (; pcVar6 < pcVar7; pcVar6 = pcVar6 + 1) {
    *pcVar6 = ' ';
  }
  strncpy(pcVar8,local_e0,(long)(int)sVar4);
  pcVar8[8] = '=';
  pcVar8[9] = ' ';
  sVar4 = (size_t)iVar1;
  if (*value == '\'') {
    strncpy(pcVar8 + 10,value,sVar4);
    uVar3 = 0x1e;
    if (0x13 < iVar1) {
      uVar3 = iVar1 + 0xc;
    }
  }
  else {
    strncpy(pcVar8 + (0x1e - sVar4),value,sVar4);
    uVar3 = 0x1e;
  }
  if (0 < iVar2) {
    iVar1 = 0x4e - uVar3;
    if ((int)(iVar2 + uVar3 + 2) < 0x51) {
      iVar1 = iVar2;
    }
    uVar11 = (ulong)uVar3;
    pcVar8[uVar11 + 2] = '/';
    strncpy(pcVar8 + uVar11 + 3,newcom,(long)iVar1);
    for (pcVar8 = pcVar8 + (long)iVar1 + uVar11 + 3; pcVar8 < pcVar7; pcVar8 = pcVar8 + 1) {
      *pcVar8 = ' ';
    }
  }
  return;
}

Assistant:

static void
hputc (hstring,keyword,value)

char *hstring;
char *keyword;
char *value;	/* character string containing the value for variable
		   keyword.  trailing and leading blanks are removed.  */
{
    char squot = 39;
    char line[100];
    char newcom[50];
    char blank[80];
    char *v, *vp, *v1, *v2, *q1, *q2, *c1, *ve;
    int lkeyword, lcom, lval, lc, i;

    for (i = 0; i < 80; i++)
	blank[i] = ' ';

    /*  find length of keyword and value */
    lkeyword = strlen (keyword);
    lval = strlen (value);

    /*  If COMMENT or HISTORY, always add it just before the END */
    if (lkeyword == 7 && (strncmp (keyword,"COMMENT",7) == 0 ||
	strncmp (keyword,"HISTORY",7) == 0)) {

	/* Find end of header */
	v1 = ksearch (hstring,"END");
	v2 = v1 + 80;

	/* Move END down one line */
	strncpy (v2, v1, 80);

	/* Insert keyword */
	strncpy (v1,keyword,7);

	/* Pad with spaces */
	for (vp = v1+lkeyword; vp < v2; vp++)
	    *vp = ' ';

	/* Insert comment */
	strncpy (v1+9,value,lval);
	return;
	}

    /* Otherwise search for keyword */
    else
	v1 = ksearch (hstring,keyword);

    /*  If parameter is not found, find a place to put it */
    if (v1 == NULL) {
	
	/* First look for blank lines before END */
        v1 = blsearch (hstring, "END");
    
	/*  Otherwise, create a space for it at the end of the header */
	if (v1 == NULL) {
	    ve = ksearch (hstring,"END");
	    v1 = ve;
	    v2 = v1 + 80;
	    strncpy (v2, ve, 80);
	    }
	else
	    v2 = v1 + 80;
	lcom = 0;
	newcom[0] = 0;
	}

    /*  Otherwise, extract the entry for this keyword from the header */
    else {
	strncpy (line, v1, 80);
	line[80] = 0;
	v2 = v1 + 80;

	/*  check for quoted value */
	q1 = strchr (line, squot);
	if (q1 != NULL)
	    q2 = strchr (q1+1,squot);
	else
	    q2 = line;

	/*  extract comment and remove trailing spaces */

	c1 = strchr (q2,'/');
	if (c1 != NULL) {
	    lcom = 80 - (c1 - line);
	    strncpy (newcom, c1+1, lcom);
	    vp = newcom + lcom - 1;
	    while (vp-- > newcom && *vp == ' ')
		*vp = 0;
	    lcom = strlen (newcom);
	    }
	else {
	    newcom[0] = 0;
	    lcom = 0;
	    }
	}

    /* Fill new entry with spaces */
    for (vp = v1; vp < v2; vp++)
	*vp = ' ';

    /*  Copy keyword to new entry */
    strncpy (v1, keyword, lkeyword);

    /*  Add parameter value in the appropriate place */
    vp = v1 + 8;
    *vp = '=';
    vp = v1 + 9;
    *vp = ' ';
    vp = vp + 1;
    if (*value == squot) {
	strncpy (vp, value, lval);
	if (lval+12 > 31)
	    lc = lval + 12;
	else
	    lc = 30;
	}
    else {
	vp = v1 + 30 - lval;
	strncpy (vp, value, lval);
	lc = 30;
	}

    /* Add comment in the appropriate place */
	if (lcom > 0) {
	    if (lc+2+lcom > 80)
		lcom = 78 - lc;
	    vp = v1 + lc + 2;     /* Jul 16 1997: was vp = v1 + lc * 2 */
	    *vp = '/';
	    vp = vp + 1;
	    strncpy (vp, newcom, lcom);
	    for (v = vp + lcom; v < v2; v++)
		*v = ' ';
	    }

	return;
}